

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom JS_NewAtomInt64(JSContext *ctx,int64_t n)

{
  JSAtom JVar1;
  size_t buf_len;
  JSValue JVar2;
  char buf [24];
  char local_38 [32];
  
  JVar1 = 0;
  snprintf(local_38,0x18,"%ld",n);
  buf_len = strlen(local_38);
  JVar2 = JS_NewStringLen(ctx,local_38,buf_len);
  if ((int)JVar2.tag != 6) {
    JVar1 = __JS_NewAtom(ctx->rt,(JSString *)JVar2.u.ptr,1);
  }
  return JVar1;
}

Assistant:

static JSAtom JS_NewAtomInt64(JSContext *ctx, int64_t n)
{
    if ((uint64_t)n <= JS_ATOM_MAX_INT) {
        return __JS_AtomFromUInt32((uint32_t)n);
    } else {
        char buf[24];
        JSValue val;
        snprintf(buf, sizeof(buf), "%" PRId64 , n);
        val = JS_NewString(ctx, buf);
        if (JS_IsException(val))
            return JS_ATOM_NULL;
        return __JS_NewAtom(ctx->rt, JS_VALUE_GET_STRING(val),
                            JS_ATOM_TYPE_STRING);
    }
}